

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

void displayMessage(MessageType t,ostringstream *msg)

{
  bool bVar1;
  ulong uVar2;
  ostream *poVar3;
  char *pcVar4;
  int in_ECX;
  string local_c8 [32];
  string local_a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_38 [8];
  string stack;
  ostringstream *msg_local;
  MessageType t_local;
  
  stack.field_2._8_8_ = msg;
  if (t == AUTHOR_WARNING) {
    std::operator<<((ostream *)msg,
                    "This warning is for project developers.  Use -Wno-dev to suppress it.");
  }
  else if (t == AUTHOR_ERROR) {
    std::operator<<((ostream *)msg,
                    "This error is for project developers. Use -Wno-error=dev to suppress it.");
  }
  std::operator<<((ostream *)stack.field_2._8_8_,"\n");
  if (t == INTERNAL_ERROR) {
    cmsys::SystemInformation::GetProgramStack_abi_cxx11_
              ((string *)local_38,(SystemInformation *)0x0,0,in_ECX);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      bVar1 = cmHasLiteralPrefix<std::__cxx11::string,9ul>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_38,(char (*) [9])"WARNING:");
      if (bVar1) {
        std::__cxx11::string::substr((ulong)&local_88,(ulong)local_38);
        std::operator+(&local_68,"Note:",&local_88);
        std::__cxx11::string::operator=((string *)local_38,(string *)&local_68);
        std::__cxx11::string::~string((string *)&local_68);
        std::__cxx11::string::~string((string *)&local_88);
      }
      poVar3 = std::operator<<((ostream *)stack.field_2._8_8_,(string *)local_38);
      std::operator<<(poVar3,"\n");
    }
    std::__cxx11::string::~string((string *)local_38);
  }
  if ((((t == FATAL_ERROR) || (t == INTERNAL_ERROR)) || (t == DEPRECATION_ERROR)) ||
     (t == AUTHOR_ERROR)) {
    cmSystemTools::SetErrorOccured();
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmSystemTools::Message(pcVar4,"Error");
    std::__cxx11::string::~string(local_a8);
  }
  else {
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmSystemTools::Message(pcVar4,"Warning");
    std::__cxx11::string::~string(local_c8);
  }
  return;
}

Assistant:

void displayMessage(cmake::MessageType t, std::ostringstream& msg)
{

  // Add a note about warning suppression.
  if(t == cmake::AUTHOR_WARNING)
    {
    msg <<
      "This warning is for project developers.  Use -Wno-dev to suppress it.";
    }
  else if (t == cmake::AUTHOR_ERROR)
    {
    msg <<
      "This error is for project developers. Use -Wno-error=dev to suppress "
      "it.";
    }

  // Add a terminating blank line.
  msg << "\n";

#if defined(CMAKE_BUILD_WITH_CMAKE)
  // Add a C++ stack trace to internal errors.
  if(t == cmake::INTERNAL_ERROR)
    {
    std::string stack = cmsys::SystemInformation::GetProgramStack(0,0);
    if(!stack.empty())
      {
      if(cmHasLiteralPrefix(stack, "WARNING:"))
        {
        stack = "Note:" + stack.substr(8);
        }
      msg << stack << "\n";
      }
    }
#endif

  // Output the message.
  if(t == cmake::FATAL_ERROR
     || t == cmake::INTERNAL_ERROR
     || t == cmake::DEPRECATION_ERROR
     || t == cmake::AUTHOR_ERROR)
    {
    cmSystemTools::SetErrorOccured();
    cmSystemTools::Message(msg.str().c_str(), "Error");
    }
  else
    {
    cmSystemTools::Message(msg.str().c_str(), "Warning");
    }
}